

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

DiagnosticStream * __thiscall
spvtools::val::ValidationState_t::diag
          (DiagnosticStream *__return_storage_ptr__,ValidationState_t *this,spv_result_t error_code,
          Instruction *inst)

{
  spv_const_context psVar1;
  spv_position_t position;
  spv_position_t position_00;
  spv_position_t position_01;
  size_t local_328;
  string local_2e0;
  undefined1 local_2c0 [8];
  string disassembly;
  string local_298;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_278
  ;
  undefined8 local_258;
  undefined8 local_250;
  size_t local_248;
  allocator<char> local_239;
  string local_238;
  undefined8 local_218;
  undefined8 local_210;
  size_t local_208;
  DiagnosticStream local_200;
  Instruction *local_28;
  Instruction *inst_local;
  ValidationState_t *pVStack_18;
  spv_result_t error_code_local;
  ValidationState_t *this_local;
  
  local_28 = inst;
  inst_local._4_4_ = error_code;
  pVStack_18 = this;
  this_local = (ValidationState_t *)__return_storage_ptr__;
  if (error_code == SPV_WARNING) {
    if (this->num_of_warnings_ == this->max_num_of_warnings_) {
      memset(&local_218,0,0x18);
      psVar1 = this->context_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"",&local_239);
      position.column = local_210;
      position.line = local_218;
      position.index = local_208;
      DiagnosticStream::DiagnosticStream
                (&local_200,position,&psVar1->consumer,&local_238,inst_local._4_4_);
      DiagnosticStream::operator<<
                (&local_200,(char (*) [38])"Other warnings have been suppressed.\n");
      DiagnosticStream::~DiagnosticStream(&local_200);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    if (this->max_num_of_warnings_ <= this->num_of_warnings_) {
      memset(&local_258,0,0x18);
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::function(&local_278,(nullptr_t)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"",(allocator<char> *)(disassembly.field_2._M_local_buf + 0xf)
                );
      position_00.column = local_250;
      position_00.line = local_258;
      position_00.index = local_248;
      DiagnosticStream::DiagnosticStream
                (__return_storage_ptr__,position_00,&local_278,&local_298,inst_local._4_4_);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)(disassembly.field_2._M_local_buf + 0xf));
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::~function(&local_278);
      return __return_storage_ptr__;
    }
    this->num_of_warnings_ = this->num_of_warnings_ + 1;
  }
  std::__cxx11::string::string((string *)local_2c0);
  if (local_28 != (Instruction *)0x0) {
    Disassemble_abi_cxx11_(&local_2e0,this,local_28);
    std::__cxx11::string::operator=((string *)local_2c0,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if (local_28 == (Instruction *)0x0) {
    local_328 = 0;
  }
  else {
    local_328 = val::Instruction::LineNum(local_28);
  }
  position_01.index = local_328;
  position_01.line = 0;
  position_01.column = 0;
  DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position_01,&this->context_->consumer,(string *)local_2c0,
             inst_local._4_4_);
  std::__cxx11::string::~string((string *)local_2c0);
  return __return_storage_ptr__;
}

Assistant:

DiagnosticStream ValidationState_t::diag(spv_result_t error_code,
                                         const Instruction* inst) {
  if (error_code == SPV_WARNING) {
    if (num_of_warnings_ == max_num_of_warnings_) {
      DiagnosticStream({0, 0, 0}, context_->consumer, "", error_code)
          << "Other warnings have been suppressed.\n";
    }
    if (num_of_warnings_ >= max_num_of_warnings_) {
      return DiagnosticStream({0, 0, 0}, nullptr, "", error_code);
    }
    ++num_of_warnings_;
  }

  std::string disassembly;
  if (inst) disassembly = Disassemble(*inst);

  return DiagnosticStream({0, 0, inst ? inst->LineNum() : 0},
                          context_->consumer, disassembly, error_code);
}